

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_title_screen.hpp
# Opt level: O0

void __thiscall PatchTitleScreen::inject_data(PatchTitleScreen *this,ROM *rom,World *world)

{
  World *pWVar1;
  uint32_t uVar2;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  World *local_20;
  World *world_local;
  ROM *rom_local;
  PatchTitleScreen *this_local;
  
  local_20 = world;
  world_local = (World *)rom;
  rom_local = (ROM *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  uVar2 = md::ROM::inject_bytes(rom,TITLE1_TILES,0x741,&local_40);
  this->_title1_tiles_addr = uVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pWVar1 = world_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
  uVar2 = md::ROM::inject_bytes((ROM *)pWVar1,"%\x0e\x02\x05",0x6b,&local_78);
  this->_title1_layout_addr = uVar2;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  pWVar1 = world_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  uVar2 = md::ROM::inject_bytes((ROM *)pWVar1,TITLE2_TILES,0x19b8,&local_a0);
  this->_title2_tiles_addr = uVar2;
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pWVar1 = world_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  uVar2 = md::ROM::inject_bytes((ROM *)pWVar1,"&\x10\x02_",0x54,&local_c8);
  this->_title2_layout_addr = uVar2;
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pWVar1 = world_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
  uVar2 = md::ROM::inject_bytes((ROM *)pWVar1,TITLE3_TILES,0x2463,&local_f0);
  this->_title3_tiles_addr = uVar2;
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pWVar1 = world_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
  uVar2 = md::ROM::inject_bytes((ROM *)pWVar1,TITLE3_LAYOUT,100,&local_118);
  this->_title3_layout_addr = uVar2;
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  return;
}

Assistant:

void inject_data(md::ROM& rom, World& world) override
    {
        _title1_tiles_addr = rom.inject_bytes(TITLE1_TILES, TITLE1_TILES_SIZE);
        _title1_layout_addr = rom.inject_bytes(TITLE1_LAYOUT, TITLE1_LAYOUT_SIZE);
        _title2_tiles_addr = rom.inject_bytes(TITLE2_TILES, TITLE2_TILES_SIZE);
        _title2_layout_addr = rom.inject_bytes(TITLE2_LAYOUT, TITLE2_LAYOUT_SIZE);
        _title3_tiles_addr = rom.inject_bytes(TITLE3_TILES, TITLE3_TILES_SIZE);
        _title3_layout_addr = rom.inject_bytes(TITLE3_LAYOUT, TITLE3_LAYOUT_SIZE);
    }